

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p)

{
  byte bVar1;
  XMLDocument *pXVar2;
  MemPool *pMVar3;
  int iVar4;
  XMLAttribute *this_00;
  byte *p_00;
  char *pcVar5;
  XMLAttribute *pXVar6;
  XMLAttribute **ppXVar7;
  undefined4 extraout_var;
  XMLAttribute *pXVar8;
  uint uVar9;
  byte *pbVar10;
  
  if (p == (char *)0x0) {
    return (char *)0x0;
  }
  pXVar8 = (XMLAttribute *)0x0;
  p_00 = (byte *)p;
  do {
    bVar1 = *p_00;
    while (-1 < (char)bVar1) {
      pbVar10 = p_00 + 1;
      iVar4 = isspace((uint)bVar1);
      if (iVar4 == 0) {
        uVar9 = (uint)bVar1;
        if (bVar1 == 0) {
          pXVar2 = (this->super_XMLNode)._document;
          iVar4 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
          if (CONCAT44(extraout_var,iVar4) == 0) {
            pcVar5 = StrPair::GetStr(&(this->super_XMLNode)._value);
          }
          else {
            pcVar5 = (char *)0x0;
          }
          pXVar2->_errorID = XML_ERROR_PARSING_ELEMENT;
          pXVar2->_errorStr1 = p;
          pXVar2->_errorStr2 = pcVar5;
          return (char *)0x0;
        }
        iVar4 = isalpha(uVar9);
        if (iVar4 != 0) break;
        if (uVar9 < 0x3e) {
          if (bVar1 == 0x3a) break;
          if ((bVar1 == 0x2f) && (*pbVar10 == 0x3e)) {
            this->_closingType = 1;
            return (char *)(p_00 + 2);
          }
        }
        else {
          if (uVar9 == 0x5f) break;
          if (bVar1 == 0x3e) {
            return (char *)pbVar10;
          }
        }
        pXVar2 = (this->super_XMLNode)._document;
        pXVar2->_errorID = XML_ERROR_PARSING_ELEMENT;
        pXVar2->_errorStr1 = p;
        pXVar2->_errorStr2 = (char *)p_00;
        return (char *)0x0;
      }
      p_00 = pbVar10;
      bVar1 = *pbVar10;
    }
    this_00 = (XMLAttribute *)
              MemPoolT<72>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
    this_00->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_002aa2f0;
    (this_00->_name)._flags = 0;
    (this_00->_name)._start = (char *)0x0;
    (this_00->_name)._end = (char *)0x0;
    (this_00->_value)._flags = 0;
    *(undefined1 (*) [32])&(this_00->_value)._start = ZEXT432(0) << 0x40;
    pXVar2 = (this->super_XMLNode)._document;
    this_00->_memPool = &(pXVar2->_attributePool).super_MemPool;
    (*(pXVar2->_attributePool).super_MemPool._vptr_MemPool[5])();
    p_00 = (byte *)XMLAttribute::ParseDeep
                             (this_00,(char *)p_00,
                              ((this->super_XMLNode)._document)->_processEntities);
    if (p_00 == (byte *)0x0) {
      pMVar3 = this_00->_memPool;
      (**this_00->_vptr_XMLAttribute)(this_00);
      (*pMVar3->_vptr_MemPool[4])(pMVar3,this_00);
      pXVar2 = (this->super_XMLNode)._document;
      pXVar2->_errorID = XML_ERROR_PARSING_ATTRIBUTE;
      pXVar2->_errorStr1 = p;
      pXVar2->_errorStr2 = (char *)0x0;
      return (char *)0x0;
    }
    pcVar5 = StrPair::GetStr(&this_00->_name);
    pXVar6 = FindAttribute(this,pcVar5);
    if ((pXVar6 != (XMLAttribute *)0x0) &&
       (pcVar5 = StrPair::GetStr(&pXVar6->_value), pcVar5 != (char *)0x0)) {
      pMVar3 = this_00->_memPool;
      (**this_00->_vptr_XMLAttribute)(this_00);
      (*pMVar3->_vptr_MemPool[4])(pMVar3,this_00);
      pXVar2 = (this->super_XMLNode)._document;
      pXVar2->_errorID = XML_ERROR_PARSING_ATTRIBUTE;
      pXVar2->_errorStr1 = p;
      pXVar2->_errorStr2 = (char *)p_00;
      return (char *)0x0;
    }
    ppXVar7 = &pXVar8->_next;
    if (pXVar8 == (XMLAttribute *)0x0) {
      ppXVar7 = &this->_rootAttribute;
    }
    *ppXVar7 = this_00;
    pXVar8 = this_00;
  } while( true );
}

Assistant:

char* XMLElement::ParseAttributes( char* p )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
            XMLAttribute* attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
            attrib->_memPool = &_document->_attributePool;
			attrib->_memPool->SetTracked();

            p = attrib->ParseDeep( p, _document->ProcessEntities() );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                prevAttribute->_next = attrib;
            }
            else {
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p );
            return 0;
        }
    }
    return p;
}